

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSubstitutionTree.hpp
# Opt level: O0

SubstitutionTree * __thiscall
Indexing::LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::getTree
          (LiteralSubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs> *this,Literal *lit
          ,bool complementary)

{
  undefined1 uVar1;
  uint f;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *elem;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *puVar2;
  type pSVar3;
  byte in_DL;
  Term *in_RSI;
  long in_RDI;
  uint idx;
  bool findNegative;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc0;
  unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
  local_20;
  uint local_18;
  byte local_12;
  byte local_11;
  Term *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if (local_11 == 0) {
    uVar1 = Kernel::Literal::isNegative((Literal *)0x465121);
  }
  else {
    uVar1 = Kernel::Literal::isPositive((Literal *)0x465111);
  }
  local_12 = uVar1;
  f = Kernel::Term::functor(local_10);
  local_18 = toIdx(f,(bool)(local_12 & 1));
  while( true ) {
    elem = (unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
            *)(ulong)local_18;
    puVar2 = (unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
              *)Lib::
                Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
                ::size((Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
                        *)(in_RDI + 8));
    if (elem < puVar2) break;
    in_stack_ffffffffffffffb0 = &local_20;
    std::make_unique<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>>();
    Lib::
    Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
    ::push((Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
            *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),elem);
    std::
    unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
    ::~unique_ptr((unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
                   *)CONCAT17(uVar1,in_stack_ffffffffffffffc0));
  }
  Lib::
  Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
  ::operator[]((Stack<std::unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>_>
                *)(in_RDI + 8),(ulong)local_18);
  pSVar3 = std::
           unique_ptr<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>,_std::default_delete<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>_>
           ::operator*(in_stack_ffffffffffffffb0);
  return (SubstitutionTree *)pSVar3;
}

Assistant:

SubstitutionTree& getTree(Literal* lit, bool complementary)
  {
    auto findNegative = complementary ? lit->isPositive() : lit->isNegative();
    auto idx = toIdx(lit->functor(), findNegative);
    while (idx >= _trees.size()) {
      _trees.push(std::make_unique<SubstitutionTree>());
    }
    return *_trees[idx];
  }